

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O3

void rw::AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(AnimInterpolatorInfo **)((long)&interpInfoList + lVar1) == interpInfo) {
      (*DAT_0014ada0)(*(AnimInterpolatorInfo **)((long)&interpInfoList + lVar1));
      *(undefined8 *)((long)&interpInfoList + lVar1) = 0;
      return;
    }
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x50);
  return;
}

Assistant:

void
AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == interpInfo){
			rwFree(interpInfoList[i]);
			interpInfoList[i] = nil;
			return;
		}
}